

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkgitems.cpp
# Opt level: O1

void icu_63::makeTargetName
               (char *itemName,char *id,int32_t idLength,char *suffix,char *target,int32_t capacity,
               UErrorCode *pErrorCode)

{
  uint uVar1;
  char *pcVar2;
  size_t sVar3;
  undefined4 in_register_0000008c;
  int iVar4;
  
  pcVar2 = strrchr(itemName,0x2f);
  iVar4 = (int)pcVar2 + 1;
  if (pcVar2 == (char *)0x0) {
    iVar4 = (int)itemName;
  }
  iVar4 = iVar4 - (int)itemName;
  if (idLength < 0) {
    sVar3 = strlen(id);
    idLength = (int32_t)sVar3;
  }
  sVar3 = strlen(suffix);
  uVar1 = (int)sVar3 + idLength + iVar4;
  if ((int)uVar1 < 200) {
    memcpy(target,itemName,(long)iVar4);
    memcpy(target + iVar4,id,(long)idLength);
    memcpy(target + iVar4 + idLength,suffix,(long)((int)sVar3 + 1));
    return;
  }
  fprintf(_stderr,"icupkg/makeTargetName(%s) target item name length %ld too long\n",itemName,
          (ulong)uVar1);
  *(undefined4 *)CONCAT44(in_register_0000008c,capacity) = 0xf;
  return;
}

Assistant:

static void 
makeTargetName(const char *itemName, const char *id, int32_t idLength, const char *suffix,
               char *target, int32_t capacity,
               UErrorCode *pErrorCode) {
    const char *itemID;
    int32_t treeLength, suffixLength, targetLength;

    // get the item basename
    itemID=strrchr(itemName, '/');
    if(itemID!=NULL) {
        ++itemID;
    } else {
        itemID=itemName;
    }

    // build the target string
    treeLength=(int32_t)(itemID-itemName);
    if(idLength<0) {
        idLength=(int32_t)strlen(id);
    }
    suffixLength=(int32_t)strlen(suffix);
    targetLength=treeLength+idLength+suffixLength;
    if(targetLength>=capacity) {
        fprintf(stderr, "icupkg/makeTargetName(%s) target item name length %ld too long\n",
                        itemName, (long)targetLength);
        *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
        return;
    }

    memcpy(target, itemName, treeLength);
    memcpy(target+treeLength, id, idLength);
    memcpy(target+treeLength+idLength, suffix, suffixLength+1); // +1 includes the terminating NUL
}